

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_bind_string.c
# Opt level: O1

int mpt_output_bind_string(mpt_output *out,char *descr)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  char *pcVar5;
  mpt_msgtype mt;
  anon_struct_6_2_43cb1f44 bnd;
  mpt_strdest str;
  ushort local_48;
  undefined4 local_46;
  undefined2 local_42;
  byte local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  ulong local_38;
  
  iVar2 = -1;
  if (out != (mpt_output *)0x0) {
    local_46 = 0x1010700;
    local_42 = 1;
    local_40 = 3;
    local_48 = 0x300c;
    if (descr != (char *)0x0) {
      local_38 = 1;
LAB_0010861f:
      local_40 = 3;
      uVar1 = mpt_string_dest(&local_40,0x3a,descr);
      pcVar5 = descr;
      if (uVar1 != 0) {
        do {
          if ((int)uVar1 < 0) {
            mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s","bad data destination",
                           (local_46 & 0xff) + 1,pcVar5);
            return (int)local_38 + -1;
          }
          descr = pcVar5 + uVar1;
          pcVar4 = "identical data destination";
          if (local_40 != 0) {
            if ((local_40 & 1) != 0) {
              local_46._0_3_ = CONCAT12(local_3f,(undefined2)local_46);
            }
            if ((local_40 & 2) != 0) {
              local_46 = CONCAT13(local_3e,(undefined3)local_46);
            }
            if ((local_40 & 4) != 0) {
              local_42 = CONCAT11(local_42._1_1_,local_3d);
            }
            pcVar4 = "illegal data destination";
            if (local_46._2_1_ != '\0') {
              pcVar4 = "illegal data destination";
              if (local_46._3_1_ != '\0') {
                pcVar4 = "illegal data destination";
                if ((char)local_42 != '\0') goto LAB_001086de;
              }
            }
          }
          iVar2 = 0;
          mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s",pcVar4,(local_46 & 0xff) + 1,
                         pcVar5);
          uVar1 = mpt_string_dest(&local_40,0x3a,descr);
          pcVar5 = descr;
          if (uVar1 == 0) goto LAB_0010883e;
        } while( true );
      }
      iVar2 = 0;
      goto LAB_0010883e;
    }
    local_48 = 0x310c;
    iVar2 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
    if (iVar2 < 0) {
LAB_00108835:
      iVar2 = -2;
    }
    else {
      sVar3 = (*out->_vptr->push)(out,2,&local_48);
      iVar2 = (int)sVar3;
      if (-1 < (int)sVar3) {
        sVar3 = (*out->_vptr->push)(out,0,(void *)0x0);
        iVar2 = 0;
        if ((int)sVar3 < 0) {
          (*out->_vptr->push)(out,1,(void *)0x0);
          iVar2 = (int)sVar3;
        }
      }
    }
  }
  return iVar2;
LAB_001086de:
  if ((char)local_48 != '\0') {
    iVar2 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
    if (iVar2 < 0) goto LAB_00108835;
    sVar3 = (*out->_vptr->push)(out,2,&local_48);
    if ((int)sVar3 < 0) {
      return (int)sVar3;
    }
    local_48 = local_48 & 0xff00;
  }
  local_46 = local_46 & 0xffffff00;
  local_42 = local_42 & 0xff;
  sVar3 = (*out->_vptr->push)(out,6,&local_46);
  iVar2 = (int)sVar3;
  if (iVar2 < 0) goto LAB_0010883e;
  local_46 = CONCAT31(local_46._1_3_,(char)local_38);
  local_42 = CONCAT11(1,(char)local_42);
  sVar3 = (*out->_vptr->push)(out,6,&local_46);
  iVar2 = (int)sVar3;
  if (iVar2 < 0) goto LAB_0010883e;
  local_40 = 3;
  iVar2 = (int)local_38;
  local_38 = (ulong)(iVar2 + 1);
  if (iVar2 == 0xff) {
    iVar2 = 0xff;
LAB_0010883e:
    if ((-1 < iVar2) && (sVar3 = (*out->_vptr->push)(out,0,(void *)0x0), -1 < sVar3)) {
      return iVar2;
    }
    (*out->_vptr->push)(out,1,(void *)0x0);
    return -1;
  }
  goto LAB_0010861f;
}

Assistant:

extern int mpt_output_bind_string(MPT_INTERFACE(output) *out, const char *descr)
{
	MPT_STRUCT(strdest) str;
	MPT_STRUCT(msgtype) mt;
	struct {
		MPT_STRUCT(valsrc)  src;
		MPT_STRUCT(laydest) dst;
	} bnd;
	int len, dim = 1;
	
	if (!out) {
		return MPT_ERROR(BadArgument);
	}
	
	bnd.src.dim = 0;
	bnd.src.state = MPT_DATASTATE(All);
	
	bnd.dst.lay = bnd.dst.grf = bnd.dst.wld = 1;
	bnd.dst.dim = 0;
	
	str.change = 3;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(BindingAdd);
	
	if (!descr) {
		mt.arg = MPT_MESGGRF(BindingClear);
		if (out->_vptr->await(out, 0, 0) < 0) {
			return -2;
		}
		if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
			return len;
		}
		if ((len = out->_vptr->push(out, 0, 0)) < 0) {
			out->_vptr->push(out, 1, 0);
			return len;
		}
		return 0;
	}
	/* read binding description string */
	while ((len = mpt_string_dest(&str, ':', descr))) {
		if (len < 0) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                      MPT_tr("bad data destination"), bnd.src.dim+1, descr);
			return dim - 1;
		}
		descr += len;
		if (!str.change) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("identical data destination"), bnd.src.dim+1, descr-len);
			continue;
		}
		if (str.change & 1) bnd.dst.lay = str.val[0];
		if (str.change & 2) bnd.dst.grf = str.val[1];
		if (str.change & 4) bnd.dst.wld = str.val[2];
		
		if (!bnd.dst.lay || !bnd.dst.grf || !bnd.dst.wld) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("illegal data destination"), bnd.src.dim+1, descr - len);
			continue;
		}
		/* register/write header on first occasion */
		if (mt.cmd) {
			if (out->_vptr->await(out, 0, 0) < 0) {
				return -2;
			}
			if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
				return len;
			}
			mt.cmd = 0;
		}
		/* append x/y data bindings */
		bnd.src.dim = 0;
		bnd.dst.dim = 0;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		bnd.src.dim = dim;
		bnd.dst.dim = 1;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		
		str.change = 3;
		
		if ((len = dim++) == UINT8_MAX) break;
	}
	/* clear message data and registration */
	if (len < 0 || out->_vptr->push(out, 0, 0) < 0) {
		out->_vptr->push(out, 1, 0);
		return -1;
	}
	return len;
}